

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
StableBlockVector(StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this_local;
  
  this->csize = 0;
  this->dataptr = (FedInfo **)0x0;
  this->dataSlotsAvailable = 0;
  this->dataSlotIndex = 0;
  this->bsize = 0x20;
  this->freeSlotsAvailable = 0;
  this->freeIndex = 0;
  this->freeblocks = (FedInfo **)0x0;
  return;
}

Assistant:

StableBlockVector() noexcept {}